

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Equiv2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  Abc_Cex_t *local_88;
  uint local_48;
  int c;
  int fVerbose;
  int fLatchOnly;
  int fUseCex;
  int TimeLimit2;
  int TimeLimit;
  int nRounds;
  int nConfMax;
  int nFramesMax;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  nRounds = 0x14;
  TimeLimit = 500;
  TimeLimit2 = 10;
  fUseCex = 0;
  fLatchOnly = 0;
  bVar2 = false;
  c = 0;
  local_48 = 0;
  Extra_UtilGetoptReset();
LAB_0025dc15:
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"FCRTSxlvh");
    if (iVar3 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Equiv2(): There is no AIG.\n");
        return 1;
      }
      iVar3 = Gia_ManRegNum(pAbc->pGia);
      if (iVar3 == 0) {
        Abc_Print(0,"Abc_CommandAbc9Equiv2(): There is no flops. Nothing is done.\n");
        return 0;
      }
      if (bVar2) {
        if (pAbc->pCex == (Abc_Cex_t *)0x0) {
          Abc_Print(0,"Abc_CommandAbc9Equiv2(): Counter-example is not available.\n");
          return 0;
        }
        iVar3 = pAbc->pCex->nPis;
        iVar4 = Gia_ManPiNum(pAbc->pGia);
        if (iVar3 != iVar4) {
          uVar1 = pAbc->pCex->nPis;
          uVar5 = Gia_ManPiNum(pAbc->pGia);
          Abc_Print(-1,
                    "Abc_CommandAbc9Equiv2(): The number of PIs differs in cex (%d) and in AIG (%d).\n"
                    ,(ulong)uVar1,(ulong)uVar5);
          return 1;
        }
      }
      if (bVar2) {
        local_88 = pAbc->pCex;
      }
      else {
        local_88 = (Abc_Cex_t *)0x0;
      }
      Ssw_SignalFilterGia(pAbc->pGia,nRounds,TimeLimit,TimeLimit2,fUseCex,fLatchOnly,local_88,c,
                          local_48);
      pAbc->Status = -1;
      return 0;
    }
    switch(iVar3) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_0025e01e;
      }
      TimeLimit = atoi(argv[globalUtilOptind]);
      iVar3 = TimeLimit;
      break;
    default:
      goto LAB_0025e01e;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_0025e01e;
      }
      nRounds = atoi(argv[globalUtilOptind]);
      iVar3 = nRounds;
      break;
    case 0x52:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-R\" should be followed by an integer.\n");
        goto LAB_0025e01e;
      }
      TimeLimit2 = atoi(argv[globalUtilOptind]);
      iVar3 = TimeLimit2;
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_0025e01e;
      }
      fLatchOnly = atoi(argv[globalUtilOptind]);
      iVar3 = fLatchOnly;
      break;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_0025e01e;
      }
      fUseCex = atoi(argv[globalUtilOptind]);
      iVar3 = fUseCex;
      break;
    case 0x68:
      goto LAB_0025e01e;
    case 0x6c:
      c = c ^ 1;
      goto LAB_0025dc15;
    case 0x76:
      local_48 = local_48 ^ 1;
      goto LAB_0025dc15;
    case 0x78:
      bVar2 = (bool)(bVar2 ^ 1);
      goto LAB_0025dc15;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar3 < 0) {
LAB_0025e01e:
      Abc_Print(-2,"usage: &equiv2 [-FCRTS num] [-xlvh]\n");
      Abc_Print(-2,"\t         computes candidate equivalence classes\n");
      Abc_Print(-2,"\t-F num : the max number of frames for BMC [default = %d]\n",
                (ulong)(uint)nRounds);
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)TimeLimit);
      Abc_Print(-2,"\t-R num : the max number of BMC rounds [default = %d]\n",
                (ulong)(uint)TimeLimit2);
      Abc_Print(-2,"\t-T num : runtime limit in seconds for all rounds [default = %d]\n",
                (ulong)(uint)fUseCex);
      Abc_Print(-2,"\t-S num : runtime limit in seconds for one round [default = %d]\n",
                (ulong)(uint)fLatchOnly);
      pcVar6 = "no";
      if (bVar2) {
        pcVar6 = "yes";
      }
      Abc_Print(-2,"\t-x     : toggle using the current cex to perform refinement [default = %s]\n",
                pcVar6);
      pcVar6 = "no";
      if (c != 0) {
        pcVar6 = "yes";
      }
      Abc_Print(-2,"\t-l     : toggle considering only latch output equivalences [default = %s]\n",
                pcVar6);
      pcVar6 = "no";
      if (local_48 != 0) {
        pcVar6 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Equiv2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Ssw_SignalFilterGia( Gia_Man_t * p, int nFramesMax, int nConfMax, int nRounds, int TimeLimit, int TimeLimit2, Abc_Cex_t * pCex, int fLatchOnly, int fVerbose );
    int nFramesMax =   20;
    int nConfMax   =  500;
    int nRounds    =   10;
    int TimeLimit  =    0;
    int TimeLimit2 =    0;
    int fUseCex    =    0;
    int fLatchOnly =    0;
    int fVerbose   =    0;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FCRTSxlvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFramesMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfMax < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nRounds < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( TimeLimit < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            TimeLimit2 = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( TimeLimit2 < 0 )
                goto usage;
            break;
        case 'x':
            fUseCex ^= 1;
            break;
        case 'l':
            fLatchOnly ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Equiv2(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( 0, "Abc_CommandAbc9Equiv2(): There is no flops. Nothing is done.\n" );
        return 0;
    }
    if ( fUseCex )
    {
        if ( pAbc->pCex == NULL )
        {
            Abc_Print( 0, "Abc_CommandAbc9Equiv2(): Counter-example is not available.\n" );
            return 0;
        }
        if ( pAbc->pCex->nPis != Gia_ManPiNum(pAbc->pGia) )
        {
            Abc_Print( -1, "Abc_CommandAbc9Equiv2(): The number of PIs differs in cex (%d) and in AIG (%d).\n",
                pAbc->pCex->nPis, Gia_ManPiNum(pAbc->pGia) );
            return 1;
        }
    }
    Ssw_SignalFilterGia( pAbc->pGia, nFramesMax, nConfMax, nRounds, TimeLimit, TimeLimit2, fUseCex? pAbc->pCex: NULL, fLatchOnly, fVerbose );
    pAbc->Status  = -1;
//    pAbc->nFrames = pAbc->pCex->iFrame;
//    Abc_FrameReplaceCex( pAbc, &pAbc->pCex );
    return 0;

usage:
    Abc_Print( -2, "usage: &equiv2 [-FCRTS num] [-xlvh]\n" );
    Abc_Print( -2, "\t         computes candidate equivalence classes\n" );
    Abc_Print( -2, "\t-F num : the max number of frames for BMC [default = %d]\n", nFramesMax );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", nConfMax );
    Abc_Print( -2, "\t-R num : the max number of BMC rounds [default = %d]\n", nRounds );
    Abc_Print( -2, "\t-T num : runtime limit in seconds for all rounds [default = %d]\n", TimeLimit );
    Abc_Print( -2, "\t-S num : runtime limit in seconds for one round [default = %d]\n", TimeLimit2 );
    Abc_Print( -2, "\t-x     : toggle using the current cex to perform refinement [default = %s]\n", fUseCex? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle considering only latch output equivalences [default = %s]\n", fLatchOnly? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}